

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlChar *pxVar1;
  xmlXPathContextPtr ctxt_00;
  int iVar2;
  int iVar3;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlBufPtr buf;
  xmlChar *pxVar4;
  xmlXPathObjectPtr value;
  int offset;
  xmlChar *point;
  xmlBufPtr target;
  xmlXPathObjectPtr find;
  xmlXPathObjectPtr str;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 2) {
      if (ctxt->valueNr < ctxt->valueFrame + 2) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        obj = valuePop(ctxt);
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        obj_00 = valuePop(ctxt);
        buf = xmlBufCreate();
        if (buf != (xmlBufPtr)0x0) {
          pxVar4 = xmlStrstr(obj_00->stringval,obj->stringval);
          if (pxVar4 != (xmlChar *)0x0) {
            pxVar1 = obj_00->stringval;
            iVar2 = xmlStrlen(obj->stringval);
            iVar2 = ((int)pxVar4 - (int)pxVar1) + iVar2;
            pxVar4 = obj_00->stringval;
            iVar3 = xmlStrlen(obj_00->stringval);
            xmlBufAdd(buf,pxVar4 + iVar2,iVar3 - iVar2);
          }
          ctxt_00 = ctxt->context;
          pxVar4 = xmlBufContent(buf);
          value = xmlXPathCacheNewString(ctxt_00,pxVar4);
          valuePush(ctxt,value);
          xmlBufFree(buf);
        }
        xmlXPathReleaseObject(ctxt->context,obj_00);
        xmlXPathReleaseObject(ctxt->context,obj);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt, int nargs) {
  xmlXPathObjectPtr str;
  xmlXPathObjectPtr find;
  xmlBufPtr target;
  const xmlChar *point;
  int offset;

  CHECK_ARITY(2);
  CAST_TO_STRING;
  find = valuePop(ctxt);
  CAST_TO_STRING;
  str = valuePop(ctxt);

  target = xmlBufCreate();
  if (target) {
    point = xmlStrstr(str->stringval, find->stringval);
    if (point) {
      offset = point - str->stringval + xmlStrlen(find->stringval);
      xmlBufAdd(target, &str->stringval[offset],
		   xmlStrlen(str->stringval) - offset);
    }
    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
	xmlBufContent(target)));
    xmlBufFree(target);
  }
  xmlXPathReleaseObject(ctxt->context, str);
  xmlXPathReleaseObject(ctxt->context, find);
}